

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void Catch::Clara::Detail::convertInto(string *_source,bool *_dest)

{
  pointer pcVar1;
  int iVar2;
  runtime_error *this;
  long *plVar3;
  long *plVar4;
  bool bVar5;
  long lVar6;
  string sourceLC;
  long *local_90;
  long local_88;
  long local_80 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  pcVar1 = (_source->_M_dataplus)._M_p;
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + _source->_M_string_length);
  plVar3 = local_90;
  if (local_88 != 0) {
    lVar6 = 0;
    do {
      iVar2 = tolower((int)*(char *)((long)plVar3 + lVar6));
      *(char *)((long)plVar3 + lVar6) = (char)iVar2;
      lVar6 = lVar6 + 1;
    } while (local_88 != lVar6);
  }
  iVar2 = std::__cxx11::string::compare((char *)&local_90);
  bVar5 = true;
  if (iVar2 != 0) {
    iVar2 = std::__cxx11::string::compare((char *)&local_90);
    if (iVar2 != 0) {
      iVar2 = std::__cxx11::string::compare((char *)&local_90);
      if (iVar2 != 0) {
        iVar2 = std::__cxx11::string::compare((char *)&local_90);
        if (iVar2 != 0) {
          iVar2 = std::__cxx11::string::compare((char *)&local_90);
          if (iVar2 != 0) {
            iVar2 = std::__cxx11::string::compare((char *)&local_90);
            if (iVar2 != 0) {
              iVar2 = std::__cxx11::string::compare((char *)&local_90);
              if (iVar2 != 0) {
                iVar2 = std::__cxx11::string::compare((char *)&local_90);
                if (iVar2 != 0) {
                  iVar2 = std::__cxx11::string::compare((char *)&local_90);
                  if (iVar2 != 0) {
                    iVar2 = std::__cxx11::string::compare((char *)&local_90);
                    if (iVar2 != 0) {
                      this = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::operator+(&local_70,
                                     "Expected a boolean value but did not recognise:\n  \'",_source
                                    );
                      plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
                      local_50 = (long *)*plVar3;
                      plVar4 = plVar3 + 2;
                      if (local_50 == plVar4) {
                        local_40 = *plVar4;
                        lStack_38 = plVar3[3];
                        local_50 = &local_40;
                      }
                      else {
                        local_40 = *plVar4;
                      }
                      local_48 = plVar3[1];
                      *plVar3 = (long)plVar4;
                      plVar3[1] = 0;
                      *(undefined1 *)(plVar3 + 2) = 0;
                      std::runtime_error::runtime_error(this,(string *)&local_50);
                      __cxa_throw(this,&std::runtime_error::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                  }
                }
              }
            }
            bVar5 = false;
          }
        }
      }
    }
  }
  *_dest = bVar5;
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  return;
}

Assistant:

inline void convertInto( std::string const& _source, bool& _dest ) {
            std::string sourceLC = _source;
            std::transform( sourceLC.begin(), sourceLC.end(), sourceLC.begin(), ::tolower );
            if( sourceLC == "y" || sourceLC == "1" || sourceLC == "true" || sourceLC == "yes" || sourceLC == "on" )
                _dest = true;
            else if( sourceLC == "n" || sourceLC == "0" || sourceLC == "false" || sourceLC == "no" || sourceLC == "off" )
                _dest = false;
            else
                throw std::runtime_error( "Expected a boolean value but did not recognise:\n  '" + _source + "'" );
        }